

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::ParseStageMetaOpt(AsciiParser *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  storage_t<double> sVar3;
  storage_t<double> sVar4;
  storage_t<double> sVar5;
  _Base_ptr p_Var6;
  pointer pcVar7;
  size_type sVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  const_iterator cVar12;
  mapped_type *def;
  ostream *poVar13;
  long *plVar14;
  storage_t<double> *psVar15;
  float *pfVar16;
  const_iterator cVar17;
  double *pdVar18;
  undefined ***pppuVar19;
  size_type *psVar20;
  size_t *psVar21;
  anon_struct_8_0_00000001_for___align aVar22;
  long lVar23;
  undefined8 uVar24;
  char *pcVar25;
  Token *item;
  _Alloc_hider _Var26;
  anon_struct_8_0_00000001_for___align aVar27;
  ostringstream oVar28;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar29;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar30;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  optional<tinyusdz::value::StringData> pv;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> pvs;
  MetaVariable var;
  string varname;
  StringData str;
  undefined1 local_2c0 [8];
  undefined1 local_2b8 [8];
  _Rb_tree_node_base local_2b0;
  size_t local_290;
  string local_288;
  undefined8 uStack_268;
  string local_258;
  storage_union local_238;
  undefined **local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_220;
  undefined8 local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  _Base_ptr local_1c0;
  undefined1 local_1b8 [8];
  undefined1 local_1b0 [16];
  undefined1 auStack_1a0 [24];
  size_t local_188 [8];
  ios_base local_148 [264];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  anon_struct_8_0_00000001_for___align local_38;
  
  pcVar1 = local_1b0 + 8;
  local_1b0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
  auStack_1a0[8] = false;
  auStack_1a0[9] = false;
  auStack_1a0._12_4_ = 0;
  auStack_1a0._16_4_ = 0;
  local_1b8 = (undefined1  [8])pcVar1;
  bVar9 = MaybeTripleQuotedString(this,(StringData *)local_1b8);
  if (bVar9) {
LAB_003dee86:
    ::std::__cxx11::string::_M_assign((string *)&(this->_stage_metas).comment);
    (this->_stage_metas).comment.line_col = auStack_1a0._16_4_;
    (this->_stage_metas).comment.is_triple_quoted = (bool)auStack_1a0[8];
    (this->_stage_metas).comment.single_quote = (bool)auStack_1a0[9];
    *(undefined2 *)&(this->_stage_metas).comment.field_0x22 = auStack_1a0._10_2_;
    (this->_stage_metas).comment.line_row = auStack_1a0._12_4_;
    bVar9 = false;
  }
  else {
    bVar10 = MaybeString(this,(StringData *)local_1b8);
    bVar9 = true;
    if (bVar10) goto LAB_003dee86;
  }
  if (local_1b8 != (undefined1  [8])pcVar1) {
    operator_delete((void *)local_1b8,(ulong)(local_1b0._8_8_ + 1));
  }
  oVar28 = (ostringstream)0x1;
  if (!bVar9) goto LAB_003df5a9;
  local_200._M_string_length = 0;
  local_200.field_2._M_local_buf[0] = '\0';
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  bVar9 = ReadIdentifier(this,&local_200);
  if (bVar9) {
    cVar12 = ::std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
             ::find(&(this->_supported_stage_metas)._M_t,&local_200);
    if ((_Rb_tree_header *)cVar12._M_node ==
        &(this->_supported_stage_metas)._M_t._M_impl.super__Rb_tree_header) {
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b8,"\'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_200);
      plVar14 = (long *)::std::__cxx11::string::append((char *)local_1b8);
      pppuVar19 = (undefined ***)(plVar14 + 2);
      if ((undefined ***)*plVar14 == pppuVar19) {
        local_228 = *pppuVar19;
        paStack_220 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)plVar14[3];
        local_238.dynamic = &local_228;
      }
      else {
        local_228 = *pppuVar19;
        local_238.dynamic = (undefined ***)*plVar14;
      }
      local_238._8_8_ = plVar14[1];
      *plVar14 = (long)pppuVar19;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      if (local_1b8 != (undefined1  [8])pcVar1) {
        operator_delete((void *)local_1b8,(ulong)(local_1b0._8_8_ + 1));
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b8,"ParseStageMetaOpt",0x11);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
      poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b8,0x70d);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
      poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b8,(char *)local_238.dynamic,local_238._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)local_2c0);
      if (local_2c0 != (undefined1  [8])&local_2b0) {
        operator_delete((void *)local_2c0,(ulong)(local_2b0._0_8_ + 1));
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
      ::std::ios_base::~ios_base(local_148);
      if ((undefined ***)local_238.dynamic != &local_228) {
        operator_delete(local_238.dynamic,(long)local_228 + 1);
      }
      goto LAB_003df58a;
    }
    bVar9 = Expect(this,'=');
    if (!bVar9) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b8,"ParseStageMetaOpt",0x11);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
      poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b8,0x712);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b8,"\'=\' expected in Stage Metadata opt.",0x23);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_238);
      if ((undefined ***)local_238.dynamic != &local_228) {
        operator_delete(local_238.dynamic,(long)local_228 + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
      ::std::ios_base::~ios_base(local_148);
      goto LAB_003df58a;
    }
    bVar9 = SkipWhitespace(this);
    if (!bVar9) goto LAB_003df58a;
    def = ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
          ::at(&this->_supported_stage_metas,&local_200);
    paStack_220 = &local_210;
    local_228 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
    aVar27 = (anon_struct_8_0_00000001_for___align)0x0;
    local_238.dynamic = (undefined ***)0x0;
    local_218 = 0;
    local_210._M_local_buf[0] = '\0';
    bVar9 = ParseMetaValue(this,def,(MetaVariable *)&local_238);
    if (bVar9) {
      ::std::__cxx11::string::_M_assign((string *)&paStack_220);
      iVar11 = ::std::__cxx11::string::compare((char *)&local_200);
      if (iVar11 == 0) {
        local_2b8 = (undefined1  [8])0x0;
        local_2b0._0_8_ = local_2b0._0_8_ & 0xffffffffffffff00;
        local_2c0 = (undefined1  [8])&local_2b0;
        oVar28 = (ostringstream)
                 MetaVariable::get_value<tinyusdz::Token>
                           ((MetaVariable *)&local_238,(Token *)local_2c0);
        if ((bool)oVar28) {
          ::std::__cxx11::string::_M_assign((string *)&(this->_stage_metas).defaultPrim);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,"ParseStageMetaOpt",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
          poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b8,0x728);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,"`defaultPrim` isn\'t a token value.",0x22);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_288);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,
                            (ulong)(local_288.field_2._M_allocated_capacity + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
          ::std::ios_base::~ios_base(local_148);
        }
        aVar27 = (anon_struct_8_0_00000001_for___align)local_2b0._0_8_;
        aVar22 = (anon_struct_8_0_00000001_for___align)local_2c0;
        if (local_2c0 == (undefined1  [8])&local_2b0) goto LAB_003e0682;
LAB_003e067a:
        operator_delete((void *)aVar22,(ulong)((long)aVar27 + 1));
LAB_003e0682:
        if (oVar28 == (ostringstream)0x0) goto LAB_003e068a;
      }
      else {
        iVar11 = ::std::__cxx11::string::compare((char *)&local_200);
        if (iVar11 == 0) {
          local_288._M_dataplus._M_p = (pointer)0x0;
          local_288._M_string_length = 0;
          local_288.field_2._M_allocated_capacity = 0;
          oVar28 = (ostringstream)
                   MetaVariable::
                   get_value<std::vector<tinyusdz::value::AssetPath,std::allocator<tinyusdz::value::AssetPath>>>
                             ((MetaVariable *)&local_238,
                              (vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                               *)&local_288);
          sVar8 = local_288._M_string_length;
          if ((bool)oVar28) {
            if (local_288._M_dataplus._M_p != (pointer)local_288._M_string_length) {
              _Var26._M_p = local_288._M_dataplus._M_p;
              do {
                ::std::
                vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::
                push_back(&(this->_stage_metas).subLayers,(value_type *)_Var26._M_p);
                _Var26._M_p = _Var26._M_p + 0x40;
              } while (_Var26._M_p != (pointer)sVar8);
            }
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,"ParseStageMetaOpt",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
            poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b8,0x732);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,"`subLayers` isn\'t an array of asset path",0x28);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\n",1);
            ::std::__cxx11::stringbuf::str();
            PushError(this,(string *)local_2c0);
            if (local_2c0 != (undefined1  [8])&local_2b0) {
              operator_delete((void *)local_2c0,(ulong)(local_2b0._0_8_ + 1));
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
            ::std::ios_base::~ios_base(local_148);
          }
          ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::
          ~vector((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *
                  )&local_288);
          goto LAB_003e0682;
        }
        iVar11 = ::std::__cxx11::string::compare((char *)&local_200);
        if (iVar11 == 0) {
          MetaVariable::get_value<tinyusdz::Token>
                    ((optional<tinyusdz::Token> *)local_1b8,(MetaVariable *)&local_238);
          local_2c0[0] = local_1b8[0];
          if (local_1b8[0] == (ostringstream)0x1) {
            local_2b8 = (undefined1  [8])&local_2b0._M_parent;
            if ((undefined1 *)local_1b0._0_8_ == auStack_1a0) {
              local_2b0._M_left =
                   (_Base_ptr)
                   CONCAT44(auStack_1a0._12_4_,
                            CONCAT22(auStack_1a0._10_2_,CONCAT11(auStack_1a0[9],auStack_1a0[8])));
            }
            else {
              local_2b8 = (undefined1  [8])local_1b0._0_8_;
            }
            local_2b0._M_parent = (_Base_ptr)auStack_1a0._0_8_;
            local_2b0._0_8_ = local_1b0._8_8_;
            local_1b0._8_8_ = (_Link_type)0x0;
            auStack_1a0._0_8_ = auStack_1a0._0_8_ & 0xffffffffffffff00;
            local_1b0._0_8_ = auStack_1a0;
          }
          if (local_1b8[0] != (ostringstream)0x1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,"ParseStageMetaOpt",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
            poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b8,0x74e);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,"`upAxis` isn\'t a token value.",0x1d);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\n",1);
            ::std::__cxx11::stringbuf::str();
            PushError(this,&local_288);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p != &local_288.field_2) {
              operator_delete(local_288._M_dataplus._M_p,
                              (ulong)(local_288.field_2._M_allocated_capacity + 1));
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
            ::std::ios_base::~ios_base(local_148);
            oVar28 = (ostringstream)0x0;
            goto LAB_003e0660;
          }
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_288,local_2b8,local_2b0._0_8_ + (long)local_2b8);
          iVar11 = ::std::__cxx11::string::compare((char *)&local_288);
          if (iVar11 == 0) {
            (this->_stage_metas).upAxis.contained = (storage_t<tinyusdz::Axis>)0x0;
LAB_003e0636:
            oVar28 = (ostringstream)0x1;
            if ((this->_stage_metas).upAxis.has_value_ == false) {
              (this->_stage_metas).upAxis.has_value_ = true;
            }
          }
          else {
            iVar11 = ::std::__cxx11::string::compare((char *)&local_288);
            if (iVar11 == 0) {
LAB_003e062c:
              (this->_stage_metas).upAxis.contained = (storage_t<tinyusdz::Axis>)0x1;
              goto LAB_003e0636;
            }
            iVar11 = ::std::__cxx11::string::compare((char *)&local_288);
            if (iVar11 == 0) {
              (this->_stage_metas).upAxis.contained = (storage_t<tinyusdz::Axis>)0x2;
              goto LAB_003e0636;
            }
            if ((this->_option).strict_allowedToken_check != true) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[warn]",6);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b8,"ParseStageMetaOpt",0x11);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
              poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b8,0x749);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
              ::std::operator+(&local_1e0,
                               "Ignore unknown `upAxis` value. Must be \"X\", \"Y\" or \"Z\", but got \""
                               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_288);
              plVar14 = (long *)::std::__cxx11::string::append((char *)&local_1e0);
              paVar2 = &local_258.field_2;
              psVar20 = (size_type *)(plVar14 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar14 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar20) {
                local_258.field_2._M_allocated_capacity = *psVar20;
                local_258.field_2._8_8_ = plVar14[3];
                local_258._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_258.field_2._M_allocated_capacity = *psVar20;
                local_258._M_dataplus._M_p = (pointer)*plVar14;
              }
              local_258._M_string_length = plVar14[1];
              *plVar14 = (long)psVar20;
              plVar14[1] = 0;
              *(undefined1 *)(plVar14 + 2) = 0;
              poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b8,local_258._M_dataplus._M_p,
                                   local_258._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_258._M_dataplus._M_p != paVar2) {
                operator_delete(local_258._M_dataplus._M_p,
                                local_258.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                operator_delete(local_1e0._M_dataplus._M_p,
                                local_1e0.field_2._M_allocated_capacity + 1);
              }
              ::std::__cxx11::stringbuf::str();
              PushWarn(this,(string *)&local_258);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_258._M_dataplus._M_p != paVar2) {
                operator_delete(local_258._M_dataplus._M_p,
                                local_258.field_2._M_allocated_capacity + 1);
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
              ::std::ios_base::~ios_base(local_148);
              goto LAB_003e062c;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,"ParseStageMetaOpt",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
            poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b8,0x743);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            ::std::operator+(&local_1e0,
                             "Invalid `upAxis` value. Must be \"X\", \"Y\" or \"Z\", but got \"",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_288);
            plVar14 = (long *)::std::__cxx11::string::append((char *)&local_1e0);
            paVar2 = &local_258.field_2;
            psVar20 = (size_type *)(plVar14 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar14 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar20) {
              local_258.field_2._M_allocated_capacity = *psVar20;
              local_258.field_2._8_8_ = plVar14[3];
              local_258._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_258.field_2._M_allocated_capacity = *psVar20;
              local_258._M_dataplus._M_p = (pointer)*plVar14;
            }
            local_258._M_string_length = plVar14[1];
            *plVar14 = (long)psVar20;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b8,local_258._M_dataplus._M_p,
                                 local_258._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p != paVar2) {
              operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
              operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1
                             );
            }
            ::std::__cxx11::stringbuf::str();
            PushError(this,(string *)&local_258);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p != paVar2) {
              operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1
                             );
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
            ::std::ios_base::~ios_base(local_148);
            oVar28 = (ostringstream)0x0;
          }
          uVar24 = local_288.field_2._M_allocated_capacity;
          _Var26._M_p = local_288._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
LAB_003e0658:
            operator_delete(_Var26._M_p,
                            (ulong)((long)&((_Alloc_hider *)
                                           &(((_Link_type)uVar24)->super__Rb_tree_node_base).
                                            _M_color)->_M_p + 1));
          }
LAB_003e0660:
          if ((local_2c0[0] == (ostringstream)0x1) &&
             (aVar27 = (anon_struct_8_0_00000001_for___align)local_2b0._M_parent,
             aVar22 = (anon_struct_8_0_00000001_for___align)local_2b8,
             local_2b8 != (undefined1  [8])&local_2b0._M_parent)) goto LAB_003e067a;
          goto LAB_003e0682;
        }
        iVar11 = ::std::__cxx11::string::compare((char *)&local_200);
        if ((iVar11 == 0) ||
           (iVar11 = ::std::__cxx11::string::compare((char *)&local_200), iVar11 == 0)) {
          MetaVariable::get_value<tinyusdz::value::StringData>
                    ((optional<tinyusdz::value::StringData> *)local_1b8,(MetaVariable *)&local_238);
          local_2c0[0] = local_1b8[0];
          if (local_1b8[0] == (ostringstream)0x1) {
            local_2b8 = (undefined1  [8])&local_2b0._M_parent;
            aVar27 = (anon_struct_8_0_00000001_for___align)auStack_1a0;
            if ((anon_struct_8_0_00000001_for___align)local_1b0._0_8_ == aVar27) {
              local_2b0._M_left =
                   (_Base_ptr)
                   CONCAT44(auStack_1a0._12_4_,
                            CONCAT22(auStack_1a0._10_2_,CONCAT11(auStack_1a0[9],auStack_1a0[8])));
            }
            else {
              local_2b8 = (undefined1  [8])local_1b0._0_8_;
            }
            local_2b0._M_parent = (_Base_ptr)auStack_1a0._0_8_;
            local_2b0._M_right = (_Base_ptr)CONCAT44(auStack_1a0._20_4_,auStack_1a0._16_4_);
            local_2b0._0_8_ = local_1b0._8_8_;
            local_1b0._8_8_ = (_Link_type)0x0;
            auStack_1a0._0_8_ = auStack_1a0._0_8_ & 0xffffffffffffff00;
            local_290 = CONCAT44(local_290._4_4_,(undefined4)local_188[0]);
            local_1b0._0_8_ = aVar27;
          }
          if (local_1b8[0] == (ostringstream)0x1) {
            ::std::__cxx11::string::_M_assign((string *)&(this->_stage_metas).doc);
            (this->_stage_metas).doc.line_col = (int)local_290;
            *(_Base_ptr *)&(this->_stage_metas).doc.is_triple_quoted = local_2b0._M_right;
            oVar28 = (ostringstream)0x1;
          }
          else {
            MetaVariable::get_value<std::__cxx11::string>
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_1b8,(MetaVariable *)&local_238);
            oVar28 = local_1b8[0];
            local_288._M_dataplus._M_p._0_1_ = local_1b8[0];
            if (local_1b8[0] == (ostringstream)0x1) {
              local_288._M_string_length = (long)&local_288.field_2 + 8;
              aVar27 = (anon_struct_8_0_00000001_for___align)auStack_1a0;
              if ((anon_struct_8_0_00000001_for___align)local_1b0._0_8_ == aVar27) {
                uStack_268 = CONCAT44(auStack_1a0._12_4_,
                                      CONCAT22(auStack_1a0._10_2_,
                                               CONCAT11(auStack_1a0[9],auStack_1a0[8])));
              }
              else {
                local_288._M_string_length = local_1b0._0_8_;
              }
              local_288.field_2._8_8_ = auStack_1a0._0_8_;
              local_288.field_2._M_allocated_capacity = local_1b0._8_8_;
              local_1b0._8_8_ = (_Link_type)0x0;
              auStack_1a0._0_8_ = auStack_1a0._0_8_ & 0xffffffffffffff00;
              local_1b0._0_8_ = aVar27;
            }
            if (local_1b8[0] == (ostringstream)0x1) {
              local_1b0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
              auStack_1a0[8] = false;
              auStack_1a0[9] = false;
              auStack_1a0._12_4_ = 0;
              auStack_1a0._16_4_ = 0;
              local_1b8 = (undefined1  [8])pcVar1;
              ::std::__cxx11::string::_M_assign((string *)local_1b8);
              auStack_1a0[8] = false;
              ::std::__cxx11::string::_M_assign((string *)&(this->_stage_metas).doc);
              (this->_stage_metas).doc.line_col = auStack_1a0._16_4_;
              (this->_stage_metas).doc.is_triple_quoted = (bool)auStack_1a0[8];
              (this->_stage_metas).doc.single_quote = (bool)auStack_1a0[9];
              *(undefined2 *)&(this->_stage_metas).doc.field_0x22 = auStack_1a0._10_2_;
              (this->_stage_metas).doc.line_row = auStack_1a0._12_4_;
              if (local_1b8 != (undefined1  [8])pcVar1) {
                operator_delete((void *)local_1b8,(ulong)(local_1b0._8_8_ + 1));
              }
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b8,"ParseStageMetaOpt",0x11);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
              poVar13 = (ostream *)::std::ostream::operator<<((string *)local_1b8,0x75b);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
              local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1e0,"`{}` isn\'t a string value.","");
              fmt::format<std::__cxx11::string>
                        (&local_258,(fmt *)&local_1e0,(string *)&local_200,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aVar27
                        );
              poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b8,local_258._M_dataplus._M_p,
                                   local_258._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_258._M_dataplus._M_p != &local_258.field_2) {
                operator_delete(local_258._M_dataplus._M_p,
                                local_258.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                operator_delete(local_1e0._M_dataplus._M_p,
                                local_1e0.field_2._M_allocated_capacity + 1);
              }
              ::std::__cxx11::stringbuf::str();
              PushError(this,(string *)&local_258);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_258._M_dataplus._M_p != &local_258.field_2) {
                operator_delete(local_258._M_dataplus._M_p,
                                local_258.field_2._M_allocated_capacity + 1);
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
              ::std::ios_base::~ios_base(local_148);
            }
            if ((local_288._M_dataplus._M_p._0_1_ == (ostringstream)0x1) &&
               (uVar24 = local_288.field_2._8_8_, _Var26._M_p = (pointer)local_288._M_string_length,
               local_288._M_string_length != (long)&local_288.field_2 + 8)) goto LAB_003e0658;
          }
          goto LAB_003e0660;
        }
        iVar11 = ::std::__cxx11::string::compare((char *)&local_200);
        if (iVar11 == 0) {
          pfVar16 = tinyusdz::value::Value::as<float>((Value *)&local_238,false);
          if (pfVar16 == (float *)0x0) {
            psVar15 = (storage_t<double> *)
                      tinyusdz::value::Value::as<double>((Value *)&local_238,false);
            oVar28 = (ostringstream)(psVar15 != (storage_t<double> *)0x0);
            if (!(bool)oVar28) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b8,"ParseStageMetaOpt",0x11);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
              poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b8,0x766);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
              pcVar25 = "`metersPerUnit` isn\'t a floating-point value.";
              lVar23 = 0x2d;
LAB_003e0ae6:
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b8,pcVar25,lVar23);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\n",1);
              ::std::__cxx11::stringbuf::str();
              PushError(this,(string *)local_2c0);
              if (local_2c0 != (undefined1  [8])&local_2b0) {
                operator_delete((void *)local_2c0,(ulong)(local_2b0._0_8_ + 1));
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
              ::std::ios_base::~ios_base(local_148);
              goto LAB_003e0682;
            }
            (this->_stage_metas).metersPerUnit.contained = *psVar15;
          }
          else {
            (this->_stage_metas).metersPerUnit.contained = (storage_t<double>)(double)*pfVar16;
            oVar28 = (ostringstream)0x1;
          }
          if ((this->_stage_metas).metersPerUnit.has_value_ == false) {
            (this->_stage_metas).metersPerUnit.has_value_ = true;
          }
          goto LAB_003e0682;
        }
        iVar11 = ::std::__cxx11::string::compare((char *)&local_200);
        if (iVar11 == 0) {
          pfVar16 = tinyusdz::value::Value::as<float>((Value *)&local_238,false);
          if (pfVar16 == (float *)0x0) {
            psVar15 = (storage_t<double> *)
                      tinyusdz::value::Value::as<double>((Value *)&local_238,false);
            oVar28 = (ostringstream)(psVar15 != (storage_t<double> *)0x0);
            if (!(bool)oVar28) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b8,"ParseStageMetaOpt",0x11);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
              poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b8,0x771);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
              pcVar25 = "`kilogramsPerUnit` isn\'t a floating-point value.";
              lVar23 = 0x30;
              goto LAB_003e0ae6;
            }
            (this->_stage_metas).kilogramsPerUnit.contained = *psVar15;
          }
          else {
            (this->_stage_metas).kilogramsPerUnit.contained = (storage_t<double>)(double)*pfVar16;
            oVar28 = (ostringstream)0x1;
          }
          if ((this->_stage_metas).kilogramsPerUnit.has_value_ == false) {
            (this->_stage_metas).kilogramsPerUnit.has_value_ = true;
          }
          goto LAB_003e0682;
        }
        iVar11 = ::std::__cxx11::string::compare((char *)&local_200);
        if (iVar11 == 0) {
          pfVar16 = tinyusdz::value::Value::as<float>((Value *)&local_238,false);
          if (pfVar16 == (float *)0x0) {
            psVar15 = (storage_t<double> *)
                      tinyusdz::value::Value::as<double>((Value *)&local_238,false);
            oVar28 = (ostringstream)(psVar15 != (storage_t<double> *)0x0);
            if (!(bool)oVar28) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b8,"ParseStageMetaOpt",0x11);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
              poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b8,0x77d);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
              pcVar25 = "`timeCodesPerSecond` isn\'t a floating-point value.";
              lVar23 = 0x32;
              goto LAB_003e0ae6;
            }
            (this->_stage_metas).timeCodesPerSecond.contained = *psVar15;
          }
          else {
            (this->_stage_metas).timeCodesPerSecond.contained = (storage_t<double>)(double)*pfVar16;
            oVar28 = (ostringstream)0x1;
          }
          if ((this->_stage_metas).timeCodesPerSecond.has_value_ == false) {
            (this->_stage_metas).timeCodesPerSecond.has_value_ = true;
          }
          goto LAB_003e0682;
        }
        iVar11 = ::std::__cxx11::string::compare((char *)&local_200);
        if (iVar11 == 0) {
          pfVar16 = tinyusdz::value::Value::as<float>((Value *)&local_238,false);
          if (pfVar16 == (float *)0x0) {
            pdVar18 = tinyusdz::value::Value::as<double>((Value *)&local_238,false);
            uVar29 = extraout_XMM0_Da;
            uVar30 = extraout_XMM0_Db;
            if (pdVar18 != (double *)0x0) {
              uVar29 = SUB84(*pdVar18,0);
              uVar30 = (undefined4)((ulong)*pdVar18 >> 0x20);
            }
            sVar3._4_4_ = uVar30;
            sVar3._0_4_ = uVar29;
            if (pdVar18 == (double *)0x0) goto LAB_003e0687;
          }
          else {
            sVar3 = (storage_t<double>)(double)*pfVar16;
          }
          (this->_stage_metas).startTimeCode.contained = sVar3;
          if ((this->_stage_metas).startTimeCode.has_value_ == false) {
            (this->_stage_metas).startTimeCode.has_value_ = true;
          }
        }
        else {
          iVar11 = ::std::__cxx11::string::compare((char *)&local_200);
          if (iVar11 == 0) {
            pfVar16 = tinyusdz::value::Value::as<float>((Value *)&local_238,false);
            if (pfVar16 == (float *)0x0) {
              pdVar18 = tinyusdz::value::Value::as<double>((Value *)&local_238,false);
              uVar29 = extraout_XMM0_Da_00;
              uVar30 = extraout_XMM0_Db_00;
              if (pdVar18 != (double *)0x0) {
                uVar29 = SUB84(*pdVar18,0);
                uVar30 = (undefined4)((ulong)*pdVar18 >> 0x20);
              }
              sVar4._4_4_ = uVar30;
              sVar4._0_4_ = uVar29;
              if (pdVar18 == (double *)0x0) goto LAB_003e0687;
            }
            else {
              sVar4 = (storage_t<double>)(double)*pfVar16;
            }
            (this->_stage_metas).endTimeCode.contained = sVar4;
            if ((this->_stage_metas).endTimeCode.has_value_ == false) {
              (this->_stage_metas).endTimeCode.has_value_ = true;
            }
          }
          else {
            iVar11 = ::std::__cxx11::string::compare((char *)&local_200);
            if (iVar11 == 0) {
              pfVar16 = tinyusdz::value::Value::as<float>((Value *)&local_238,false);
              if (pfVar16 == (float *)0x0) {
                pdVar18 = tinyusdz::value::Value::as<double>((Value *)&local_238,false);
                uVar29 = extraout_XMM0_Da_01;
                uVar30 = extraout_XMM0_Db_01;
                if (pdVar18 != (double *)0x0) {
                  uVar29 = SUB84(*pdVar18,0);
                  uVar30 = (undefined4)((ulong)*pdVar18 >> 0x20);
                }
                sVar5._4_4_ = uVar30;
                sVar5._0_4_ = uVar29;
                if (pdVar18 == (double *)0x0) goto LAB_003e0687;
              }
              else {
                sVar5 = (storage_t<double>)(double)*pfVar16;
              }
              (this->_stage_metas).framesPerSecond.contained = sVar5;
              if ((this->_stage_metas).framesPerSecond.has_value_ == false) {
                (this->_stage_metas).framesPerSecond.has_value_ = true;
              }
            }
            else {
              iVar11 = ::std::__cxx11::string::compare((char *)&local_200);
              if (iVar11 == 0) {
                MetaVariable::
                get_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                          ((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                            *)local_1b8,(MetaVariable *)&local_238);
                local_2c0[0] = local_1b8[0];
                if (local_1b8[0] == (ostringstream)0x1) {
                  local_2b8 = (undefined1  [8])local_1b0._0_8_;
                  local_2b0._0_8_ = local_1b0._8_8_;
                  local_2b0._M_parent = (_Base_ptr)auStack_1a0._0_8_;
                  local_1b0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                  local_1b0._8_8_ = (_Link_type)0x0;
                  auStack_1a0._0_8_ = (_Link_type)0x0;
                  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_1b0)
                  ;
                }
                if (local_2c0[0] == (ostringstream)0x1) {
                  local_38 = (anon_struct_8_0_00000001_for___align)local_2b0._0_8_;
                  bVar9 = local_2b8 == (undefined1  [8])local_2b0._0_8_;
                  if (bVar9) {
                    oVar28 = (ostringstream)0x1;
                  }
                  else {
                    local_40 = &this->_supported_api_schemas;
                    local_1c0 = (_Base_ptr)
                                &(this->_supported_api_schemas)._M_t._M_impl.super__Rb_tree_header;
                    oVar28 = (ostringstream)0x1;
                    aVar27 = (anon_struct_8_0_00000001_for___align)local_2b8;
                    do {
                      cVar17 = ::std::
                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_40,(key_type *)aVar27);
                      if (cVar17._M_node == local_1c0) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b8,"[error]",7);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                   ,0x56);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b8,":",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b8,"ParseStageMetaOpt",0x11);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b8,"():",3);
                        poVar13 = (ostream *)
                                  ::std::ostream::operator<<((ostringstream *)local_1b8,0x7a0);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1b8,"\"",1);
                        poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1b8,*(char **)aVar27,
                                             (long)*(_Base_ptr *)((long)aVar27 + 8));
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13,
                                   "\" is not supported(at the moment) for `apiSchemas` in TinyUSDZ."
                                   ,0x3f);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
                        ::std::__cxx11::stringbuf::str();
                        PushError(this,&local_288);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_288._M_dataplus._M_p != &local_288.field_2) {
                          operator_delete(local_288._M_dataplus._M_p,
                                          (ulong)(local_288.field_2._M_allocated_capacity + 1));
                        }
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
                        ::std::ios_base::~ios_base(local_148);
                        oVar28 = (ostringstream)0x0;
                      }
                      if (cVar17._M_node == local_1c0) break;
                      aVar27 = (anon_struct_8_0_00000001_for___align)((long)aVar27 + 0x20);
                      bVar9 = aVar27 == local_38;
                    } while (!bVar9);
                  }
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b8,"ParseStageMetaOpt",0x11);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3)
                  ;
                  poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b8,0x7a4);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b8,"`apiSchemas` isn\'t an `token[]` type.",0x25);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\n",1);
                  ::std::__cxx11::stringbuf::str();
                  PushError(this,&local_288);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_288._M_dataplus._M_p != &local_288.field_2) {
                    operator_delete(local_288._M_dataplus._M_p,
                                    (ulong)(local_288.field_2._M_allocated_capacity + 1));
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
                  ::std::ios_base::~ios_base(local_148);
                  bVar9 = false;
                  oVar28 = (ostringstream)0x0;
                }
                if (local_2c0[0] == (ostringstream)0x1) {
                  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_2b8)
                  ;
                }
                bVar9 = !bVar9;
              }
              else {
                iVar11 = ::std::__cxx11::string::compare((char *)&local_200);
                if (iVar11 == 0) {
                  MetaVariable::
                  get_value<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                            ((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                              *)local_1b8,(MetaVariable *)&local_238);
                  pcVar7 = (pointer)CONCAT44(auStack_1a0._12_4_,auStack_1a0._16_4_);
                  local_2c0[0] = local_1b8[0];
                  if (local_1b8[0] == (ostringstream)0x1) {
                    local_2b0._M_left = &local_2b0;
                    if ((_Link_type)auStack_1a0._0_8_ == (_Link_type)0x0) {
                      psVar21 = &local_290;
                      local_2b0._0_8_ = (ulong)(uint)local_2b0._4_4_ << 0x20;
                      local_2b0._M_parent = (_Base_ptr)0x0;
                      local_2b0._M_right = local_2b0._M_left;
                    }
                    else {
                      psVar21 = local_188;
                      local_2b0._M_color = local_1b0._8_4_;
                      local_2b0._M_parent = (_Base_ptr)auStack_1a0._0_8_;
                      p_Var6 = (_Base_ptr)
                               CONCAT44(auStack_1a0._12_4_,
                                        CONCAT22(auStack_1a0._10_2_,
                                                 CONCAT11(auStack_1a0[9],auStack_1a0[8])));
                      local_2b0._M_right =
                           (_Base_ptr)CONCAT44(auStack_1a0._20_4_,auStack_1a0._16_4_);
                      *(_Base_ptr *)(auStack_1a0._0_8_ + 8) = local_2b0._M_left;
                      local_290 = CONCAT44(local_188[0]._4_4_,(undefined4)local_188[0]);
                      auStack_1a0._0_8_ = (_Link_type)0x0;
                      auStack_1a0[8] = SUB81(pcVar1,0);
                      auStack_1a0[9] = (undefined1)((ulong)pcVar1 >> 8);
                      auStack_1a0._10_2_ = (undefined2)((ulong)pcVar1 >> 0x10);
                      auStack_1a0._12_4_ = (undefined4)((ulong)pcVar1 >> 0x20);
                      local_2b0._M_left = p_Var6;
                      auStack_1a0._20_4_ = auStack_1a0._12_4_;
                      pcVar7 = pcVar1;
                    }
                    auStack_1a0._12_4_ = (undefined4)((ulong)pcVar7 >> 0x20);
                    auStack_1a0._16_4_ = SUB84(pcVar7,0);
                    *psVar21 = 0;
                    ::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                *)local_1b0,(_Link_type)auStack_1a0._0_8_);
                  }
                  oVar28 = local_2c0[0];
                  if (local_2c0[0] == (ostringstream)0x1) {
                    std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                    ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                 *)&(this->_stage_metas).customLayerData,
                                (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                 *)local_2b8);
                  }
                  else {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                               ,0x56);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b8,"ParseStageMetaOpt",0x11);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b8,"():",3);
                    poVar13 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_1b8,0x7aa);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b8,"`customLayerData` isn\'t a dictionary value.",
                               0x2b);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b8,"\n",1);
                    ::std::__cxx11::stringbuf::str();
                    PushError(this,&local_288);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_288._M_dataplus._M_p != &local_288.field_2) {
                      operator_delete(local_288._M_dataplus._M_p,
                                      (ulong)(local_288.field_2._M_allocated_capacity + 1));
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
                    ::std::ios_base::~ios_base(local_148);
                  }
                  if (local_2c0[0] == (ostringstream)0x1) {
                    ::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                *)local_2b8,(_Link_type)local_2b0._M_parent);
                  }
                }
                else {
                  iVar11 = ::std::__cxx11::string::compare((char *)&local_200);
                  if (iVar11 != 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b8,"[warn]",6);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                               ,0x56);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b8,"ParseStageMetaOpt",0x11);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b8,"():",3);
                    poVar13 = (ostream *)
                              ::std::ostream::operator<<
                                        ((optional<tinyusdz::value::StringData> *)local_1b8,0x7ba);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b8,"TODO: Stage meta: ",0x12);
                    poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1b8,local_200._M_dataplus._M_p,
                                         local_200._M_string_length);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
                    ::std::__cxx11::stringbuf::str();
                    PushWarn(this,(string *)local_2c0);
                    if (local_2c0 != (undefined1  [8])&local_2b0) {
                      operator_delete((void *)local_2c0,(ulong)(local_2b0._0_8_ + 1));
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
                    ::std::ios_base::~ios_base(local_148);
                    goto LAB_003e0687;
                  }
                  MetaVariable::get_value<tinyusdz::value::StringData>
                            ((optional<tinyusdz::value::StringData> *)local_1b8,
                             (MetaVariable *)&local_238);
                  local_2c0[0] = local_1b8[0];
                  if (local_1b8[0] == (ostringstream)0x1) {
                    if ((undefined1 *)local_1b0._0_8_ == auStack_1a0) {
                      local_2b0._M_left =
                           (_Base_ptr)
                           CONCAT44(auStack_1a0._12_4_,
                                    CONCAT22(auStack_1a0._10_2_,
                                             CONCAT11(auStack_1a0[9],auStack_1a0[8])));
                      local_2b8 = (undefined1  [8])&local_2b0._M_parent;
                    }
                    else {
                      local_2b8 = (undefined1  [8])local_1b0._0_8_;
                    }
                    local_2b0._M_parent = (_Base_ptr)auStack_1a0._0_8_;
                    local_2b0._M_right = (_Base_ptr)CONCAT44(auStack_1a0._20_4_,auStack_1a0._16_4_);
                    local_2b0._0_8_ = local_1b0._8_8_;
                    local_1b0._8_8_ = (_Link_type)0x0;
                    auStack_1a0._0_8_ = auStack_1a0._0_8_ & 0xffffffffffffff00;
                    local_290 = CONCAT44(local_290._4_4_,(undefined4)local_188[0]);
                    local_1b0._0_8_ = auStack_1a0;
                  }
                  if (local_1b8[0] == (ostringstream)0x1) {
                    ::std::__cxx11::string::_M_assign((string *)&(this->_stage_metas).comment);
                    (this->_stage_metas).comment.line_col = (int)local_290;
                    *(_Base_ptr *)&(this->_stage_metas).comment.is_triple_quoted =
                         local_2b0._M_right;
                    oVar28 = (ostringstream)0x1;
                  }
                  else {
                    MetaVariable::get_value<std::__cxx11::string>
                              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_1b8,(MetaVariable *)&local_238);
                    oVar28 = local_1b8[0];
                    aVar27 = (anon_struct_8_0_00000001_for___align)((long)&local_288.field_2 + 8);
                    local_288._M_dataplus._M_p._0_1_ = local_1b8[0];
                    aVar22 = aVar27;
                    if (local_1b8[0] == (ostringstream)0x1) {
                      aVar22 = (anon_struct_8_0_00000001_for___align)auStack_1a0;
                      if ((anon_struct_8_0_00000001_for___align)local_1b0._0_8_ == aVar22) {
                        uStack_268 = CONCAT44(auStack_1a0._12_4_,
                                              CONCAT22(auStack_1a0._10_2_,
                                                       CONCAT11(auStack_1a0[9],auStack_1a0[8])));
                        local_288._M_string_length = (size_type)aVar27;
                      }
                      else {
                        local_288._M_string_length = local_1b0._0_8_;
                      }
                      local_288.field_2._8_8_ = auStack_1a0._0_8_;
                      local_288.field_2._M_allocated_capacity = local_1b0._8_8_;
                      local_1b0._8_8_ = (_Link_type)0x0;
                      auStack_1a0._0_8_ = auStack_1a0._0_8_ & 0xffffffffffffff00;
                      local_1b0._0_8_ = aVar22;
                    }
                    if (local_1b8[0] == (ostringstream)0x1) {
                      local_1b0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                      local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
                      auStack_1a0[8] = false;
                      auStack_1a0[9] = false;
                      auStack_1a0._12_4_ = 0;
                      auStack_1a0._16_4_ = 0;
                      local_1b8 = (undefined1  [8])pcVar1;
                      ::std::__cxx11::string::_M_assign((string *)local_1b8);
                      auStack_1a0[8] = false;
                      ::std::__cxx11::string::_M_assign((string *)&(this->_stage_metas).comment);
                      (this->_stage_metas).comment.line_col = auStack_1a0._16_4_;
                      (this->_stage_metas).comment.is_triple_quoted = (bool)auStack_1a0[8];
                      (this->_stage_metas).comment.single_quote = (bool)auStack_1a0[9];
                      *(undefined2 *)&(this->_stage_metas).comment.field_0x22 = auStack_1a0._10_2_;
                      (this->_stage_metas).comment.line_row = auStack_1a0._12_4_;
                      if (local_1b8 != (undefined1  [8])pcVar1) {
                        operator_delete((void *)local_1b8,(ulong)(local_1b0._8_8_ + 1));
                      }
                    }
                    else {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b8,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                 ,0x56);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b8,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b8,"ParseStageMetaOpt",0x11);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b8,"():",3);
                      poVar13 = (ostream *)
                                ::std::ostream::operator<<((ostringstream *)local_1b8,0x7b6);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_1e0,"`{}` isn\'t a string value.","");
                      fmt::format<std::__cxx11::string>
                                (&local_258,(fmt *)&local_1e0,(string *)&local_200,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)aVar22);
                      poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_1b8,local_258._M_dataplus._M_p,
                                           local_258._M_string_length);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_258._M_dataplus._M_p != &local_258.field_2) {
                        operator_delete(local_258._M_dataplus._M_p,
                                        local_258.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                        operator_delete(local_1e0._M_dataplus._M_p,
                                        local_1e0.field_2._M_allocated_capacity + 1);
                      }
                      ::std::__cxx11::stringbuf::str();
                      PushError(this,(string *)&local_258);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_258._M_dataplus._M_p != &local_258.field_2) {
                        operator_delete(local_258._M_dataplus._M_p,
                                        local_258.field_2._M_allocated_capacity + 1);
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
                      ::std::ios_base::~ios_base(local_148);
                    }
                    if ((local_288._M_dataplus._M_p._0_1_ == (ostringstream)0x1) &&
                       (local_288._M_string_length != (long)&local_288.field_2 + 8)) {
                      operator_delete((void *)local_288._M_string_length,
                                      (ulong)(local_288.field_2._8_8_ + 1));
                    }
                  }
                  if ((local_2c0[0] == (ostringstream)0x1) &&
                     (local_2b8 != (undefined1  [8])&local_2b0._M_parent)) {
                    operator_delete((void *)local_2b8,(ulong)((long)local_2b0._M_parent + 1));
                  }
                }
                bVar9 = oVar28 == (ostringstream)0x0;
              }
              if (bVar9) goto LAB_003e068a;
            }
          }
        }
      }
LAB_003e0687:
      oVar28 = (ostringstream)0x1;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b8,"ParseStageMetaOpt",0x11);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
      poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b8,0x71d);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b8,"Failed to parse meta value.\n",0x1c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)local_2c0);
      if (local_2c0 != (undefined1  [8])&local_2b0) {
        operator_delete((void *)local_2c0,(ulong)(local_2b0._0_8_ + 1));
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
      ::std::ios_base::~ios_base(local_148);
      oVar28 = (ostringstream)0x0;
    }
LAB_003e068a:
    if (paStack_220 != &local_210) {
      operator_delete(paStack_220,
                      CONCAT71(local_210._M_allocated_capacity._1_7_,local_210._M_local_buf[0]) + 1)
      ;
    }
    if (local_228 != (undefined **)0x0) {
      (*(code *)local_228[4])(&local_238);
      local_228 = (undefined **)0x0;
    }
  }
  else {
LAB_003df58a:
    oVar28 = (ostringstream)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,
                    CONCAT71(local_200.field_2._M_allocated_capacity._1_7_,
                             local_200.field_2._M_local_buf[0]) + 1);
  }
LAB_003df5a9:
  return (bool)((byte)oVar28 & 1);
}

Assistant:

bool AsciiParser::ParseStageMetaOpt() {
  // Maybe string-only comment.
  // Comment cannot have multiple lines. The last one wins
  {
    value::StringData str;
    if (MaybeTripleQuotedString(&str)) {
      _stage_metas.comment = str;
      return true;
    } else if (MaybeString(&str)) {
      _stage_metas.comment = str;
      return true;
    }
  }

  std::string varname;
  if (!ReadIdentifier(&varname)) {
    return false;
  }

  DCOUT("varname = " << varname);

  if (!IsStageMeta(varname)) {
    std::string msg = "'" + varname + "' is not a Stage Metadata variable.\n";
    PUSH_ERROR_AND_RETURN(msg);
    return false;
  }

  if (!Expect('=')) {
    PUSH_ERROR_AND_RETURN("'=' expected in Stage Metadata opt.");
    return false;
  }

  if (!SkipWhitespace()) {
    return false;
  }

  const VariableDef &vardef = _supported_stage_metas.at(varname);
  MetaVariable var;
  if (!ParseMetaValue(vardef, &var)) {
    PUSH_ERROR_AND_RETURN("Failed to parse meta value.\n");
    return false;
  }
  var.set_name(varname);

  if (varname == "defaultPrim") {
    value::token tok;
    if (var.get_value(&tok)) {
      DCOUT("defaultPrim = " << tok);
      _stage_metas.defaultPrim = tok;
    } else {
      PUSH_ERROR_AND_RETURN("`defaultPrim` isn't a token value.");
    }
  } else if (varname == "subLayers") {
    std::vector<value::AssetPath> paths;
    if (var.get_value(&paths)) {
      DCOUT("subLayers = " << paths);
      for (const auto &item : paths) {
        _stage_metas.subLayers.push_back(item);
      }
    } else {
      PUSH_ERROR_AND_RETURN("`subLayers` isn't an array of asset path");
    }
  } else if (varname == "upAxis") {
    if (auto pv = var.get_value<value::token>()) {
      DCOUT("upAxis = " << pv.value());
      const std::string s = pv.value().str();
      if (s == "X") {
        _stage_metas.upAxis = Axis::X;
      } else if (s == "Y") {
        _stage_metas.upAxis = Axis::Y;
      } else if (s == "Z") {
        _stage_metas.upAxis = Axis::Z;
      } else {
        if (_option.strict_allowedToken_check) {
          PUSH_ERROR_AND_RETURN(
              "Invalid `upAxis` value. Must be \"X\", \"Y\" or \"Z\", but got "
              "\"" +
              s + "\"(Note: Case sensitive)");
        } else {
          PUSH_WARN(
              "Ignore unknown `upAxis` value. Must be \"X\", \"Y\" or \"Z\", "
              "but got "
              "\"" +
              s + "\"(Note: Case sensitive). Use default upAxis `Y`.");
          _stage_metas.upAxis = Axis::Y;
        }
      }
    } else {
      PUSH_ERROR_AND_RETURN("`upAxis` isn't a token value.");
    }
  } else if ((varname == "doc") || (varname == "documentation")) {
    // `documentation` will be shorten to `doc`
    if (auto pv = var.get_value<value::StringData>()) {
      DCOUT("doc = " << to_string(pv.value()));
      _stage_metas.doc = pv.value();
    } else if (auto pvs = var.get_value<std::string>()) {
      value::StringData sdata;
      sdata.value = pvs.value();
      sdata.is_triple_quoted = false;
      _stage_metas.doc = sdata;
    } else {
      PUSH_ERROR_AND_RETURN(fmt::format("`{}` isn't a string value.", varname));
    }
  } else if (varname == "metersPerUnit") {
    DCOUT("ty = " << var.type_name());
    if (auto pv = var.get_value<float>()) {
      DCOUT("metersPerUnit = " << pv.value());
      _stage_metas.metersPerUnit = double(pv.value());
    } else if (auto pvd = var.get_value<double>()) {
      DCOUT("metersPerUnit = " << pvd.value());
      _stage_metas.metersPerUnit = pvd.value();
    } else {
      PUSH_ERROR_AND_RETURN("`metersPerUnit` isn't a floating-point value.");
    }
  } else if (varname == "kilogramsPerUnit") {
    DCOUT("ty = " << var.type_name());
    if (auto pv = var.get_value<float>()) {
      DCOUT("kilogramsPerUnit = " << pv.value());
      _stage_metas.kilogramsPerUnit = double(pv.value());
    } else if (auto pvd = var.get_value<double>()) {
      DCOUT("kilogramsPerUnit = " << pvd.value());
      _stage_metas.kilogramsPerUnit = pvd.value();
    } else {
      PUSH_ERROR_AND_RETURN("`kilogramsPerUnit` isn't a floating-point value.");
    }
  } else if (varname == "timeCodesPerSecond") {
    DCOUT("ty = " << var.type_name());
    if (auto pv = var.get_value<float>()) {
      DCOUT("metersPerUnit = " << pv.value());
      _stage_metas.timeCodesPerSecond = double(pv.value());
    } else if (auto pvd = var.get_value<double>()) {
      DCOUT("metersPerUnit = " << pvd.value());
      _stage_metas.timeCodesPerSecond = pvd.value();
    } else {
      PUSH_ERROR_AND_RETURN(
          "`timeCodesPerSecond` isn't a floating-point value.");
    }
  } else if (varname == "startTimeCode") {
    if (auto pv = var.get_value<float>()) {
      DCOUT("startTimeCode = " << pv.value());
      _stage_metas.startTimeCode = double(pv.value());
    } else if (auto pvd = var.get_value<double>()) {
      DCOUT("startTimeCode = " << pvd.value());
      _stage_metas.startTimeCode = pvd.value();
    }
  } else if (varname == "endTimeCode") {
    if (auto pv = var.get_value<float>()) {
      DCOUT("endTimeCode = " << pv.value());
      _stage_metas.endTimeCode = double(pv.value());
    } else if (auto pvd = var.get_value<double>()) {
      DCOUT("endTimeCode = " << pvd.value());
      _stage_metas.endTimeCode = pvd.value();
    }
  } else if (varname == "framesPerSecond") {
    if (auto pv = var.get_value<float>()) {
      DCOUT("framesPerSecond = " << pv.value());
      _stage_metas.framesPerSecond = double(pv.value());
    } else if (auto pvd = var.get_value<double>()) {
      DCOUT("framesPerSecond = " << pvd.value());
      _stage_metas.framesPerSecond = pvd.value();
    }
  } else if (varname == "apiSchemas") {
    // TODO: ListEdit qualifer check
    if (auto pv = var.get_value<std::vector<value::token>>()) {
      for (auto &item : pv.value()) {
        if (IsSupportedAPISchema(item.str())) {
          // OK
        } else {
          PUSH_ERROR_AND_RETURN("\"" << item.str()
                                     << "\" is not supported(at the moment) "
                                        "for `apiSchemas` in TinyUSDZ.");
        }
      }
    } else {
      PUSH_ERROR_AND_RETURN("`apiSchemas` isn't an `token[]` type.");
    }
  } else if (varname == "customLayerData") {
    if (auto pv = var.get_value<Dictionary>()) {
      _stage_metas.customLayerData = pv.value();
    } else {
      PUSH_ERROR_AND_RETURN("`customLayerData` isn't a dictionary value.");
    }
  } else if (varname == "comment") {
    if (auto pv = var.get_value<value::StringData>()) {
      DCOUT("comment = " << to_string(pv.value()));
      _stage_metas.comment = pv.value();
    } else if (auto pvs = var.get_value<std::string>()) {
      value::StringData sdata;
      sdata.value = pvs.value();
      sdata.is_triple_quoted = false;
      _stage_metas.comment = sdata;
    } else {
      PUSH_ERROR_AND_RETURN(fmt::format("`{}` isn't a string value.", varname));
    }
  } else {
    DCOUT("TODO: Stage meta: " << varname);
    PUSH_WARN("TODO: Stage meta: " << varname);
  }

  return true;
}